

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getTypeInfoFromNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *uriStr,XMLCh *localPart)

{
  int iVar1;
  SchemaGrammar *this_00;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *this_01;
  XMLCh *key;
  ComplexTypeInfo *pCVar2;
  ComplexTypeInfo *typeInfo;
  Grammar *grammar;
  XMLCh *localPart_local;
  XMLCh *uriStr_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  this_00 = (SchemaGrammar *)GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
  if ((this_00 != (SchemaGrammar *)0x0) &&
     (iVar1 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[5])(), iVar1 == 1))
  {
    XMLBuffer::set(&this->fBuffer,uriStr);
    XMLBuffer::append(&this->fBuffer,L',');
    XMLBuffer::append(&this->fBuffer,localPart);
    this_01 = SchemaGrammar::getComplexTypeRegistry(this_00);
    key = XMLBuffer::getRawBuffer(&this->fBuffer);
    pCVar2 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                       (this_01,key);
    return pCVar2;
  }
  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,uriStr,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
  return (ComplexTypeInfo *)0x0;
}

Assistant:

ComplexTypeInfo* TraverseSchema::getTypeInfoFromNS(const DOMElement* const elem,
                                                   const XMLCh* const uriStr,
                                                   const XMLCh* const localPart)
{

    Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

    if (grammar != 0 && grammar->getGrammarType() == Grammar::SchemaGrammarType) {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        ComplexTypeInfo* typeInfo =
            ((SchemaGrammar*)grammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        return typeInfo;
    }
    else {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
    }

    return 0;
}